

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_set_version(exr_context_t ctxt,int part_index,int32_t val)

{
  exr_attribute_t **attr;
  pthread_mutex_t *__mutex;
  exr_priv_part_t p_Var1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar3;
  exr_context_t nonc;
  
  if (val != 1) {
    return 4;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar2;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar2 = 0x15;
LAB_0011e3fc:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar2);
    return eVar2;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar2 = 8;
    goto LAB_0011e3fc;
  }
  p_Var1 = ctxt->parts[(uint)part_index];
  attr = &p_Var1->version;
  peVar3 = p_Var1->version;
  if (peVar3 == (exr_attribute_t *)0x0) {
    eVar2 = exr_attr_list_add(ctxt,&p_Var1->attributes,"version",EXR_ATTR_INT,0,(uint8_t **)0x0,attr
                             );
    if (eVar2 != 0) goto LAB_0011e49c;
    peVar3 = *attr;
  }
  else if (peVar3->type != EXR_ATTR_INT) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar2 = (*ctxt->print_error)
                      (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",(*attr)->type_name
                       ,"version",ctxt->print_error);
    return eVar2;
  }
  (peVar3->field_6).f = 1.4013e-45;
  eVar2 = 0;
LAB_0011e49c:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar2;
}

Assistant:

exr_result_t
exr_set_version (exr_context_t ctxt, int part_index, int32_t val)
{
    /* version number for deep data, expect 1 */
    if (val <= 0 || val > 1) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    {
        REQ_ATTR_FIND_CREATE (version, EXR_ATTR_INT);
        if (rv == EXR_ERR_SUCCESS) { attr->i = val; }
        return EXR_UNLOCK_AND_RETURN (rv);
    }
}